

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

tmbchar ParseTagName(TidyDocImpl *doc)

{
  char cVar1;
  int iVar2;
  Lexer *lexer;
  uint c;
  Bool BVar3;
  char cVar4;
  uint uVar5;
  bool bVar6;
  
  lexer = doc->lexer;
  iVar2 = *(int *)((doc->config).value + 0x18);
  if (iVar2 == 0) {
    cVar1 = lexer->lexbuf[lexer->txtstart];
    if ((-1 < cVar1) && ((lexmap[(uint)(int)cVar1] & 0x40) != 0)) {
      if (cVar1 < '\0') {
        bVar6 = true;
      }
      else {
        bVar6 = (lexmap[(uint)(int)cVar1] & 0x40) == 0;
      }
      cVar4 = cVar1 + ' ';
      if (bVar6) {
        cVar4 = cVar1;
      }
      lexer->lexbuf[lexer->txtstart] = cVar4;
    }
  }
  c = prvTidyReadChar(doc->docIn);
  while (c != 0xffffffff) {
    uVar5 = c;
    if (iVar2 == 0) {
      if ((0x7f < c) || ((lexmap[c] & 4) == 0)) break;
LAB_001322d8:
      if ((c < 0x80) && ((lexmap[c] & 0x40) != 0)) {
        bVar6 = true;
        if (c < 0x80) {
          bVar6 = (lexmap[c] & 0x40) == 0;
        }
        uVar5 = c + 0x20;
        if (bVar6) {
          uVar5 = c;
        }
      }
    }
    else {
      BVar3 = prvTidyIsXMLNamechar(c);
      if (BVar3 == no) break;
      if (iVar2 == 0) goto LAB_001322d8;
    }
    prvTidyAddCharToLexer(lexer,uVar5);
    c = prvTidyReadChar(doc->docIn);
  }
  lexer->txtend = lexer->lexsize;
  return (tmbchar)c;
}

Assistant:

static tmbchar ParseTagName( TidyDocImpl* doc )
{
    Lexer *lexer = doc->lexer;
    uint c = lexer->lexbuf[ lexer->txtstart ];
    Bool xml = cfgBool(doc, TidyXmlTags);

    /* fold case of first character in buffer */
    if (!xml && TY_(IsUpper)(c))
        lexer->lexbuf[lexer->txtstart] = (tmbchar) TY_(ToLower)(c);

    while ((c = TY_(ReadChar)(doc->docIn)) != EndOfStream)
    {
        if ((!xml && !TY_(IsNamechar)(c)) ||
            (xml && !TY_(IsXMLNamechar)(c)))
            break;

        /* fold case of subsequent characters */
        if (!xml && TY_(IsUpper)(c))
             c = TY_(ToLower)(c);

        TY_(AddCharToLexer)(lexer, c);
    }

    lexer->txtend = lexer->lexsize;
    return (tmbchar) c;
}